

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall Logger::Logger(Logger *this,string *logPath)

{
  string *logPath_local;
  Logger *this_local;
  
  std::ofstream::ofstream(this);
  std::__cxx11::string::string((string *)&this->mLastLog);
  std::ofstream::open((string *)this,(_Ios_Openmode)logPath);
  return;
}

Assistant:

Logger::Logger(const std::string &logPath) {
    mLogStream.open(logPath, std::ios::out);
}